

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O0

char * archive_entry_copy_fflags_text_len(archive_entry *entry,char *flags,size_t flags_length)

{
  char *pcVar1;
  size_t flags_length_local;
  char *flags_local;
  archive_entry *entry_local;
  
  archive_mstring_copy_mbs_len(&entry->ae_fflags_text,flags,flags_length);
  pcVar1 = ae_strtofflags(flags,flags_length,&entry->ae_fflags_set,&entry->ae_fflags_clear);
  return pcVar1;
}

Assistant:

const char *
archive_entry_copy_fflags_text_len(struct archive_entry *entry,
    const char *flags, size_t flags_length)
{
	archive_mstring_copy_mbs_len(&entry->ae_fflags_text, flags, flags_length);
	return (ae_strtofflags(flags, flags_length,
		    &entry->ae_fflags_set, &entry->ae_fflags_clear));
}